

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_WriteVarint64_Test::TestBody
          (VarintCasesWithSizes_WriteVarint64_Test *this)

{
  size_t *lhs;
  bool bVar1;
  ParamType *pPVar2;
  ParamType *pPVar3;
  pointer *__ptr;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_c8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_90;
  CodedOutputStream coded_output;
  ArrayOutputStream output;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  pPVar3 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  ArrayOutputStream::ArrayOutputStream
            (&output,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,
             (pPVar3->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  CodedOutputStream::CodedOutputStream<google::protobuf::io::ArrayOutputStream,void>
            (&coded_output,&output);
  CodedOutputStream::WriteVarint64
            (&coded_output,
             (pPVar2->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
             super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
             _M_head_impl.value);
  bVar1 = CodedOutputStream::HadError(&coded_output);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"coded_output.HadError()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x125,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CodedOutputStream::ByteCount(&coded_output);
  lhs = &(pPVar2->
         super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
         super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
         _M_head_impl.size;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"kVarintCases_case.size","coded_output.ByteCount()",lhs,
             (int *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x127,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  CodedOutputStream::~CodedOutputStream(&coded_output);
  gtest_ar._0_8_ = ArrayOutputStream::ByteCount(&output);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)&coded_output,"kVarintCases_case.size","output.ByteCount()",lhs,
             (long *)&gtest_ar);
  if ((char)coded_output.impl_.end_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (coded_output.impl_.buffer_end_ == (uint8_t *)0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)coded_output.impl_.buffer_end_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x12a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&coded_output.impl_.buffer_end_);
  gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
  gtest_ar_._0_4_ =
       memcmp(&io::(anonymous_namespace)::CodedStreamTest::buffer_,
              &(pPVar2->
               super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>)
               .
               super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>
              ,*lhs);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&coded_output,"0",
             "memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size)",(int *)&gtest_ar,
             (int *)&gtest_ar_);
  if ((char)coded_output.impl_.end_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (coded_output.impl_.buffer_end_ == (uint8_t *)0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)coded_output.impl_.buffer_end_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,300,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&coded_output.impl_.buffer_end_);
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, WriteVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteVarint64(kVarintCases_case.value);
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(kVarintCases_case.size, coded_output.ByteCount());
  }

  EXPECT_EQ(kVarintCases_case.size, output.ByteCount());
  EXPECT_EQ(0,
            memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size));
}